

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_hash_set.c
# Opt level: O0

TIFFHashSet *
TIFFHashSetNew(TIFFHashSetHashFunc fnHashFunc,TIFFHashSetEqualFunc fnEqualFunc,
              TIFFHashSetFreeEltFunc fnFreeEltFunc)

{
  void *pvVar1;
  TIFFHashSetEqualFunc local_40;
  TIFFHashSetHashFunc local_38;
  TIFFHashSet *set;
  TIFFHashSetFreeEltFunc fnFreeEltFunc_local;
  TIFFHashSetEqualFunc fnEqualFunc_local;
  TIFFHashSetHashFunc fnHashFunc_local;
  
  fnHashFunc_local = (TIFFHashSetHashFunc)malloc(0x40);
  if (fnHashFunc_local == (TIFFHashSetHashFunc)0x0) {
    fnHashFunc_local = (TIFFHashSetHashFunc)0x0;
  }
  else {
    local_38 = fnHashFunc;
    if (fnHashFunc == (TIFFHashSetHashFunc)0x0) {
      local_38 = TIFFHashSetHashPointer;
    }
    *(TIFFHashSetHashFunc *)fnHashFunc_local = local_38;
    local_40 = fnEqualFunc;
    if (fnEqualFunc == (TIFFHashSetEqualFunc)0x0) {
      local_40 = TIFFHashSetEqualPointer;
    }
    *(TIFFHashSetEqualFunc *)(fnHashFunc_local + 8) = local_40;
    *(TIFFHashSetFreeEltFunc *)(fnHashFunc_local + 0x10) = fnFreeEltFunc;
    *(undefined4 *)(fnHashFunc_local + 0x20) = 0;
    pvVar1 = calloc(8,0x35);
    *(void **)(fnHashFunc_local + 0x18) = pvVar1;
    if (*(long *)(fnHashFunc_local + 0x18) == 0) {
      free(fnHashFunc_local);
      fnHashFunc_local = (TIFFHashSetHashFunc)0x0;
    }
    else {
      *(undefined4 *)(fnHashFunc_local + 0x24) = 0;
      *(undefined4 *)(fnHashFunc_local + 0x28) = 0x35;
      *(undefined8 *)(fnHashFunc_local + 0x30) = 0;
      *(undefined4 *)(fnHashFunc_local + 0x38) = 0;
      fnHashFunc_local[0x3c] = (code)0x0;
    }
  }
  return (TIFFHashSet *)fnHashFunc_local;
}

Assistant:

TIFFHashSet *TIFFHashSetNew(TIFFHashSetHashFunc fnHashFunc,
                            TIFFHashSetEqualFunc fnEqualFunc,
                            TIFFHashSetFreeEltFunc fnFreeEltFunc)
{
    TIFFHashSet *set = (TIFFHashSet *)malloc(sizeof(TIFFHashSet));
    if (set == NULL)
        return NULL;
    set->fnHashFunc = fnHashFunc ? fnHashFunc : TIFFHashSetHashPointer;
    set->fnEqualFunc = fnEqualFunc ? fnEqualFunc : TIFFHashSetEqualPointer;
    set->fnFreeEltFunc = fnFreeEltFunc;
    set->nSize = 0;
    set->tabList = (TIFFList **)(calloc(sizeof(TIFFList *), 53));
    if (set->tabList == NULL)
    {
        free(set);
        return NULL;
    }
    set->nIndiceAllocatedSize = 0;
    set->nAllocatedSize = 53;
    set->psRecyclingList = NULL;
    set->nRecyclingListSize = 0;
    set->bRehash = false;
#ifdef HASH_DEBUG
    set->nCollisions = 0;
#endif
    return set;
}